

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5WriteAppendTerm(Fts5Index *p,Fts5SegWriter *pWriter,int nTerm,u8 *pTerm)

{
  int iVar1;
  int local_4c;
  int local_48;
  int n;
  int nMin;
  Fts5Buffer *pPgidx;
  Fts5PageWriter *pPage;
  int nPrefix;
  u8 *pTerm_local;
  int nTerm_local;
  Fts5SegWriter *pWriter_local;
  Fts5Index *p_local;
  
  local_4c = nTerm;
  if ((pWriter->writer).term.n < nTerm) {
    local_4c = (pWriter->writer).term.n;
  }
  if (p->pConfig->pgsz <= (pWriter->writer).buf.n + (pWriter->writer).pgidx.n + nTerm + 2) {
    if ((4 < (pWriter->writer).buf.n) && (fts5WriteFlushLeaf(p,pWriter), p->rc != 0)) {
      return;
    }
    if ((uint)(pWriter->writer).buf.nSpace < (uint)((pWriter->writer).buf.n + nTerm + 0x14)) {
      sqlite3Fts5BufferSize(&p->rc,&(pWriter->writer).buf,nTerm + 0x14 + (pWriter->writer).buf.n);
    }
  }
  iVar1 = sqlite3Fts5PutVarint
                    ((pWriter->writer).pgidx.p + (pWriter->writer).pgidx.n,
                     (long)((pWriter->writer).buf.n - (pWriter->writer).iPrevPgidx));
  (pWriter->writer).pgidx.n = iVar1 + (pWriter->writer).pgidx.n;
  (pWriter->writer).iPrevPgidx = (pWriter->writer).buf.n;
  if (pWriter->bFirstTermInPage == '\0') {
    pPage._4_4_ = fts5PrefixCompress(local_4c,(pWriter->writer).term.p,pTerm);
    sqlite3Fts5BufferAppendVarint(&p->rc,&(pWriter->writer).buf,(long)pPage._4_4_);
  }
  else {
    pPage._4_4_ = 0;
    if ((pWriter->writer).pgno != 1) {
      local_48 = nTerm;
      if ((pWriter->writer).term.n != 0) {
        local_48 = fts5PrefixCompress(local_4c,(pWriter->writer).term.p,pTerm);
        local_48 = local_48 + 1;
      }
      fts5WriteBtreeTerm(p,pWriter,local_48,pTerm);
      if (p->rc != 0) {
        return;
      }
    }
  }
  pPgidx = (Fts5Buffer *)&pWriter->writer;
  sqlite3Fts5BufferAppendVarint(&p->rc,&(pWriter->writer).buf,(long)(nTerm - pPage._4_4_));
  sqlite3Fts5BufferAppendBlob(&p->rc,&(pWriter->writer).buf,nTerm - pPage._4_4_,pTerm + pPage._4_4_)
  ;
  sqlite3Fts5BufferSet(&p->rc,&(pWriter->writer).term,nTerm,pTerm);
  pWriter->bFirstTermInPage = '\0';
  pWriter->bFirstRowidInPage = '\0';
  pWriter->bFirstRowidInDoclist = '\x01';
  pWriter->aDlidx->pgno = *(int *)&pPgidx->p;
  return;
}

Assistant:

static void fts5WriteAppendTerm(
  Fts5Index *p, 
  Fts5SegWriter *pWriter,
  int nTerm, const u8 *pTerm 
){
  int nPrefix;                    /* Bytes of prefix compression for term */
  Fts5PageWriter *pPage = &pWriter->writer;
  Fts5Buffer *pPgidx = &pWriter->writer.pgidx;
  int nMin = MIN(pPage->term.n, nTerm);

  assert( p->rc==SQLITE_OK );
  assert( pPage->buf.n>=4 );
  assert( pPage->buf.n>4 || pWriter->bFirstTermInPage );

  /* If the current leaf page is full, flush it to disk. */
  if( (pPage->buf.n + pPgidx->n + nTerm + 2)>=p->pConfig->pgsz ){
    if( pPage->buf.n>4 ){
      fts5WriteFlushLeaf(p, pWriter);
      if( p->rc!=SQLITE_OK ) return;
    }
    fts5BufferGrow(&p->rc, &pPage->buf, nTerm+FTS5_DATA_PADDING);
  }
  
  /* TODO1: Updating pgidx here. */
  pPgidx->n += sqlite3Fts5PutVarint(
      &pPgidx->p[pPgidx->n], pPage->buf.n - pPage->iPrevPgidx
  );
  pPage->iPrevPgidx = pPage->buf.n;
#if 0
  fts5PutU16(&pPgidx->p[pPgidx->n], pPage->buf.n);
  pPgidx->n += 2;
#endif

  if( pWriter->bFirstTermInPage ){
    nPrefix = 0;
    if( pPage->pgno!=1 ){
      /* This is the first term on a leaf that is not the leftmost leaf in
      ** the segment b-tree. In this case it is necessary to add a term to
      ** the b-tree hierarchy that is (a) larger than the largest term 
      ** already written to the segment and (b) smaller than or equal to
      ** this term. In other words, a prefix of (pTerm/nTerm) that is one
      ** byte longer than the longest prefix (pTerm/nTerm) shares with the
      ** previous term. 
      **
      ** Usually, the previous term is available in pPage->term. The exception
      ** is if this is the first term written in an incremental-merge step.
      ** In this case the previous term is not available, so just write a
      ** copy of (pTerm/nTerm) into the parent node. This is slightly
      ** inefficient, but still correct.  */
      int n = nTerm;
      if( pPage->term.n ){
        n = 1 + fts5PrefixCompress(nMin, pPage->term.p, pTerm);
      }
      fts5WriteBtreeTerm(p, pWriter, n, pTerm);
      if( p->rc!=SQLITE_OK ) return;
      pPage = &pWriter->writer;
    }
  }else{
    nPrefix = fts5PrefixCompress(nMin, pPage->term.p, pTerm);
    fts5BufferAppendVarint(&p->rc, &pPage->buf, nPrefix);
  }

  /* Append the number of bytes of new data, then the term data itself
  ** to the page. */
  fts5BufferAppendVarint(&p->rc, &pPage->buf, nTerm - nPrefix);
  fts5BufferAppendBlob(&p->rc, &pPage->buf, nTerm - nPrefix, &pTerm[nPrefix]);

  /* Update the Fts5PageWriter.term field. */
  fts5BufferSet(&p->rc, &pPage->term, nTerm, pTerm);
  pWriter->bFirstTermInPage = 0;

  pWriter->bFirstRowidInPage = 0;
  pWriter->bFirstRowidInDoclist = 1;

  assert( p->rc || (pWriter->nDlidx>0 && pWriter->aDlidx[0].buf.n==0) );
  pWriter->aDlidx[0].pgno = pPage->pgno;
}